

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testapi.c
# Opt level: O0

int test_xmlCtxtSetDict(void)

{
  int iVar1;
  int iVar2;
  xmlParserCtxtPtr val;
  xmlDictPtr val_00;
  int local_2c;
  int n_dict;
  xmlDictPtr dict;
  int n_ctxt;
  xmlParserCtxtPtr ctxt;
  int mem_base;
  int test_ret;
  
  ctxt._4_4_ = 0;
  for (dict._4_4_ = 0; (int)dict._4_4_ < 3; dict._4_4_ = dict._4_4_ + 1) {
    for (local_2c = 0; local_2c < 2; local_2c = local_2c + 1) {
      iVar1 = xmlMemBlocks();
      val = gen_xmlParserCtxtPtr(dict._4_4_,0);
      val_00 = gen_xmlDictPtr(local_2c,1);
      xmlCtxtSetDict(val,val_00);
      call_tests = call_tests + 1;
      des_xmlParserCtxtPtr(dict._4_4_,val,0);
      des_xmlDictPtr(local_2c,val_00,1);
      xmlResetLastError();
      iVar2 = xmlMemBlocks();
      if (iVar1 != iVar2) {
        iVar2 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlCtxtSetDict",(ulong)(uint)(iVar2 - iVar1));
        ctxt._4_4_ = ctxt._4_4_ + 1;
        printf(" %d",(ulong)dict._4_4_);
        printf(" %d");
        printf("\n");
      }
    }
  }
  function_tests = function_tests + 1;
  return ctxt._4_4_;
}

Assistant:

static int
test_xmlCtxtSetDict(void) {
    int test_ret = 0;

    int mem_base;
    xmlParserCtxtPtr ctxt; /* parser context */
    int n_ctxt;
    xmlDictPtr dict; /* dictionary */
    int n_dict;

    for (n_ctxt = 0;n_ctxt < gen_nb_xmlParserCtxtPtr;n_ctxt++) {
    for (n_dict = 0;n_dict < gen_nb_xmlDictPtr;n_dict++) {
        mem_base = xmlMemBlocks();
        ctxt = gen_xmlParserCtxtPtr(n_ctxt, 0);
        dict = gen_xmlDictPtr(n_dict, 1);

        xmlCtxtSetDict(ctxt, dict);
        call_tests++;
        des_xmlParserCtxtPtr(n_ctxt, ctxt, 0);
        des_xmlDictPtr(n_dict, dict, 1);
        xmlResetLastError();
        if (mem_base != xmlMemBlocks()) {
            printf("Leak of %d blocks found in xmlCtxtSetDict",
	           xmlMemBlocks() - mem_base);
	    test_ret++;
            printf(" %d", n_ctxt);
            printf(" %d", n_dict);
            printf("\n");
        }
    }
    }
    function_tests++;

    return(test_ret);
}